

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

double __thiscall
imrt::EvaluationFunction::eval
          (EvaluationFunction *this,Plan *p,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  EvaluationFunction *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  __type_conflict _Var5;
  int in_stack_00000030;
  int in_stack_00000034;
  vector<double,_std::allocator<double>_> *in_stack_00000038;
  vector<double,_std::allocator<double>_> *in_stack_00000040;
  Plan *in_stack_00000048;
  int k;
  double pen;
  int o;
  double in_stack_ffffffffffffff78;
  value_type in_stack_ffffffffffffff80;
  undefined4 local_3c;
  undefined8 local_38;
  undefined4 local_2c;
  
  std::
  set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  ::clear((set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
           *)0x1209f9);
  generate_Z((EvaluationFunction *)pen,in_stack_00000048);
  *(undefined8 *)(in_RDI + 0x68) = 0;
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x48); local_2c = local_2c + 1) {
    local_38 = 0.0;
    local_3c = 0;
    while( true ) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_2c);
      if (*pvVar2 <= local_3c) break;
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)local_2c);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_3c);
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)local_2c);
      if (dVar1 < *pvVar4) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_2c);
        dVar1 = *pvVar4;
        std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)local_2c);
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)local_2c);
        std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_3c);
        _Var5 = std::pow<double,int>
                          (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20)
                          );
        local_38 = dVar1 * _Var5 + local_38;
      }
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)local_2c);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_3c);
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)local_2c);
      if (*pvVar4 <= dVar1 && dVar1 != *pvVar4) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_2c);
        dVar1 = *pvVar4;
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)local_2c);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_3c);
        in_stack_ffffffffffffff80 = *pvVar4;
        std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)local_2c);
        _Var5 = std::pow<double,int>
                          (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20)
                          );
        local_38 = dVar1 * _Var5 + local_38;
      }
      update_sorted_voxels
                ((EvaluationFunction *)pen,
                 (vector<double,_std::allocator<double>_> *)in_stack_00000048,in_stack_00000040,
                 in_stack_00000038,in_stack_00000034,in_stack_00000030);
      update_beamlets_impact(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,(double)in_RCX);
      local_3c = local_3c + 1;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_2c);
    *(double *)(in_RDI + 0x68) = local_38 / (double)*pvVar2 + *(double *)(in_RDI + 0x68);
    in_stack_ffffffffffffff78 = local_38;
  }
  n_evaluations = n_evaluations + 1;
  return *(double *)(in_RDI + 0x68);
}

Assistant:

double EvaluationFunction::eval(const Plan& p, vector<double>& w, vector<double>& Zmin, vector<double>& Zmax){
	voxels.clear();
	generate_Z(p);
	F=0.0;
	for(int o=0; o<nb_organs; o++){
		double pen=0.0;
		for(int k=0; k<nb_voxels[o]; k++){
			if(Z[o][k] < Zmin[o] )
				 pen += w[o] * ( pow(Zmin[o]-Z[o][k], 2) );

			if(Z[o][k] > Zmax[o] )
				 pen += w[o] * ( pow(Z[o][k]-Zmax[o], 2) );

			update_sorted_voxels(w, Zmin, Zmax, o, k);
			update_beamlets_impact(o, k);
		}
		F+=pen/nb_voxels[o];
	}

	//for(auto b:beamlet_impact)
		//cout << b.first.first << "," << b.first.second << ":" << b.second << " " << endl;

	n_evaluations++;
	return F;
}